

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O1

void mpr_print_addr_set(avl_tree *set)

{
  undefined8 uVar1;
  ulong uVar2;
  list_entity *plVar3;
  netaddr_str buf1;
  
  plVar3 = (set->list_head).next;
  if (plVar3->prev != (set->list_head).prev) {
    do {
      uVar2 = (ulong)LOG_MPR;
      if (((&log_global_mask)[uVar2] & 1) != 0) {
        uVar1 = netaddr_to_prefixstring(&buf1,&plVar3[-2].prev,0);
        oonf_log(1,uVar2,"src/nhdp/mpr/neighbor-graph.c",0xe1,0,0,"%s",uVar1);
      }
      plVar3 = plVar3->next;
    } while (plVar3->prev != (set->list_head).prev);
  }
  return;
}

Assistant:

void
mpr_print_addr_set(struct avl_tree *set) {
  struct addr_node *current_node;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf1;
#endif

  avl_for_each_element(set, current_node, _avl_node) {
    OONF_DEBUG(LOG_MPR, "%s", netaddr_to_string(&buf1, &current_node->addr));
  }
}